

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::MethodOptions::Clear(MethodOptions *this)

{
  long lVar1;
  
  internal::ExtensionSet::Clear(&this->_extensions_);
  if (0 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_) {
    lVar1 = 0;
    do {
      (**(code **)(*(this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_[lVar1] + 0x20
                  ))();
      lVar1 = lVar1 + 1;
    } while (lVar1 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  }
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = 0;
  this->_has_bits_[0] = 0;
  if ((this->_unknown_fields_).fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    UnknownFieldSet::ClearFallback(&this->_unknown_fields_);
    return;
  }
  return;
}

Assistant:

void MethodOptions::Clear() {
  _extensions_.Clear();
  uninterpreted_option_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}